

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

void leveldb::AppendInternalKey(string *result,ParsedInternalKey *key)

{
  std::__cxx11::string::append((char *)result,(ulong)(key->user_key).data_);
  PutFixed64(result,key->sequence << 8 | (ulong)key->type);
  return;
}

Assistant:

void AppendInternalKey(std::string* result, const ParsedInternalKey& key) {
  result->append(key.user_key.data(), key.user_key.size());
  PutFixed64(result, PackSequenceAndType(key.sequence, key.type));
}